

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

void __thiscall
Reader::parseexpression
          (Reader *this,iterator *it,iterator end,shared_ptr<Expression> *expr,bool isobj)

{
  ProcessedTokenType PVar1;
  ProcessedToken *pPVar2;
  char *__s;
  element_type *peVar3;
  char *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  pointer psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  shared_ptr<Expression> *psVar11;
  ProcessedToken *pPVar12;
  invalid_argument *piVar13;
  ProcessedToken *pPVar14;
  undefined7 in_register_00000081;
  ProcessedToken *pPVar15;
  shared_ptr<QuadTerm> quadterm_2;
  shared_ptr<LinTerm> linterm;
  string name;
  value_type local_b8;
  Reader *local_a0;
  value_type local_98;
  undefined1 local_88 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_68;
  pointer local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  shared_ptr<Expression> *local_40;
  char local_34;
  
  _local_34 = (undefined4)CONCAT71(in_register_00000081,isobj);
  pPVar2 = it->_M_current;
  local_a0 = this;
  if ((pPVar2 != end._M_current) && (pPVar2->type == CONID)) {
    __s = (pPVar2->field_1).name;
    peVar3 = (expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pcVar4 = (char *)(peVar3->name)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&peVar3->name,0,pcVar4,(ulong)__s);
    it->_M_current = it->_M_current + 1;
  }
  if (it->_M_current != end._M_current) {
    local_a0 = (Reader *)&local_a0->builder;
    local_40 = expr;
    do {
      pPVar2 = it->_M_current + 1;
      if (((pPVar2 == end._M_current) || (it->_M_current->type != CONST)) || (pPVar2->type != VARID)
         ) {
        pPVar12 = it->_M_current;
        PVar1 = pPVar12->type;
        if (PVar1 == VARID) {
          std::__cxx11::string::string
                    ((string *)&local_78,(pPVar12->field_1).name,(allocator *)&local_98);
          local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)operator_new(0x18);
          ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x3ff0000000000000;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<LinTerm*>
                    (&local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (LinTerm *)
                     local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x3ff0000000000000;
          Builder::getvarbyname((Builder *)&local_b8,(string *)local_a0);
          _Var8._M_pi = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          peVar7 = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var5 = ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1
                   ).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)peVar7;
          ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          if (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
          }
          std::vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>::
          push_back(&((expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     linterms,(value_type *)&local_98);
          it->_M_current = it->_M_current + 1;
          goto LAB_001df426;
        }
        if (PVar1 == CONST) {
          peVar3 = (expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          peVar3->offset = (pPVar12->field_1).value + peVar3->offset;
LAB_001df37b:
          pPVar12 = pPVar12 + 1;
LAB_001df37f:
          it->_M_current = pPVar12;
          goto LAB_001df449;
        }
        if (PVar1 == BRKOP && pPVar2 != end._M_current) {
          pPVar12 = pPVar12 + 1;
          it->_M_current = pPVar12;
          while ((pPVar12 != end._M_current && (pPVar12->type != BRKCL))) {
            pPVar12 = it->_M_current;
            pPVar2 = pPVar12 + 1;
            pPVar15 = pPVar12 + 2;
            if (pPVar2 == end._M_current) {
              pPVar15 = pPVar2;
            }
            pPVar14 = pPVar15 + (pPVar15 != end._M_current);
            if (((pPVar14 == end._M_current) || (it->_M_current->type != CONST)) ||
               ((pPVar2->type != VARID || ((pPVar15->type != HAT || (pPVar14->type != CONST)))))) {
              if ((pPVar15 != end._M_current) &&
                 (((it->_M_current->type == VARID && (pPVar2->type == HAT)) &&
                  (pPVar15->type == CONST)))) {
                std::__cxx11::string::string
                          ((string *)&local_78,(it->_M_current->field_1).name,(allocator *)&local_98
                          );
                if (((pPVar15->field_1).value != 2.0) || (NAN((pPVar15->field_1).value))) {
                  piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument
                            (piVar13,"File not existent or illegal file format.");
                  __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)operator_new(0x28);
                psVar11 = local_40;
                ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
                super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
                super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
                super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
                super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                (local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coef =
                     1.0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QuadTerm*>
                          (&local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                           local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ;
                (local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coef =
                     1.0;
                Builder::getvarbyname((Builder *)&local_b8,(string *)local_a0);
                _Var8._M_pi = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                peVar7 = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->var1).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
                super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)peVar7;
                ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
                super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     _Var8._M_pi;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                Builder::getvarbyname((Builder *)&local_b8,(string *)local_a0);
                _Var8._M_pi = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                peVar7 = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
                super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)peVar7;
                ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
                super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     _Var8._M_pi;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>
                ::push_back(&((psVar11->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->quadterms,&local_98);
                goto LAB_001df73a;
              }
              if (((pPVar14 == end._M_current) || (it->_M_current->type != CONST)) ||
                 ((pPVar2->type != VARID ||
                  ((pPVar15->type != ASTERISK || (pPVar14->type != VARID)))))) {
                if ((pPVar15 == end._M_current) ||
                   (((it->_M_current->type != VARID || (pPVar2->type != ASTERISK)) ||
                    (pPVar15->type != VARID)))) break;
                std::__cxx11::string::string
                          ((string *)&local_78,(it->_M_current->field_1).name,(allocator *)&local_98
                          );
                std::__cxx11::string::string
                          ((string *)&local_98,(pPVar15->field_1).name,(allocator *)&local_b8);
                local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)operator_new(0x28);
                psVar11 = local_40;
                ((element_type *)
                local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                upperbound = 0.0;
                (((element_type *)
                 local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
                _M_dataplus._M_p = (pointer)0x0;
                *(undefined8 *)
                 &((element_type *)
                  local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type =
                     0;
                ((element_type *)
                local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                lowerbound = 0.0;
                (((element_type *)
                 local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
                _M_string_length = 0x3ff0000000000000;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QuadTerm*>
                          (&local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                           local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ;
                ((string *)
                ((long)local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                0x18))->_M_string_length = 0x3ff0000000000000;
                Builder::getvarbyname((Builder *)&stack0xffffffffffffffa8,(string *)local_a0);
                p_Var10 = p_Stack_50;
                psVar9 = local_58;
                local_58 = (pointer)0x0;
                p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          ((long)local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 8);
                *(pointer *)
                 &(local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1 =
                     psVar9;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
                 ) = p_Var10;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
                }
                Builder::getvarbyname((Builder *)&stack0xffffffffffffffa8,(string *)local_a0);
                p_Var10 = p_Stack_50;
                psVar9 = local_58;
                local_58 = (pointer)0x0;
                p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         (((string *)
                          ((long)local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x18))->_M_dataplus)._M_p;
                *(pointer *)
                 &(local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2 =
                     psVar9;
                (((string *)
                 ((long)local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 0x18))->_M_dataplus)._M_p = (pointer)p_Var10;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
                }
                std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>
                ::push_back(&((psVar11->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->quadterms,&local_b8);
              }
              else {
                std::__cxx11::string::string
                          ((string *)&local_78,pPVar12[1].field_1.name,(allocator *)&local_98);
                std::__cxx11::string::string
                          ((string *)&local_98,(pPVar14->field_1).name,(allocator *)&local_b8);
                psVar11 = local_40;
                local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)operator_new(0x28);
                ((element_type *)
                local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                upperbound = 0.0;
                (((element_type *)
                 local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
                _M_dataplus._M_p = (pointer)0x0;
                *(undefined8 *)
                 &((element_type *)
                  local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type =
                     0;
                ((element_type *)
                local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                lowerbound = 0.0;
                (((element_type *)
                 local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
                _M_string_length = 0x3ff0000000000000;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QuadTerm*>
                          (&local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                           local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ;
                ((string *)
                ((long)local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                0x18))->_M_string_length = (size_type)it->_M_current->field_1;
                Builder::getvarbyname((Builder *)&stack0xffffffffffffffa8,(string *)local_a0);
                p_Var10 = p_Stack_50;
                psVar9 = local_58;
                local_58 = (pointer)0x0;
                p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          ((long)local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 8);
                *(pointer *)
                 &(local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1 =
                     psVar9;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
                 ) = p_Var10;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
                }
                Builder::getvarbyname((Builder *)&stack0xffffffffffffffa8,(string *)local_a0);
                p_Var10 = p_Stack_50;
                psVar9 = local_58;
                local_58 = (pointer)0x0;
                p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         (((string *)
                          ((long)local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x18))->_M_dataplus)._M_p;
                *(pointer *)
                 &(local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2 =
                     psVar9;
                (((string *)
                 ((long)local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 0x18))->_M_dataplus)._M_p = (pointer)p_Var10;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
                }
                std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>
                ::push_back(&((psVar11->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->quadterms,&local_b8);
                pPVar14 = pPVar14 + 1;
              }
              it->_M_current = pPVar14;
              if (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (QuadTerm *)local_88) {
                operator_delete(local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
              }
            }
            else {
              std::__cxx11::string::string
                        ((string *)&local_78,pPVar12[1].field_1.name,(allocator *)&local_98);
              psVar11 = local_40;
              if (((pPVar14->field_1).value != 2.0) || (NAN((pPVar14->field_1).value))) {
                piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument
                          (piVar13,"File not existent or illegal file format.");
                __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
              local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)operator_new(0x28);
              ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
              ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
              ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              (local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coef = 1.0
              ;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QuadTerm*>
                        (&local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              (local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->coef =
                   (double)it->_M_current->field_1;
              Builder::getvarbyname((Builder *)&local_b8,(string *)local_a0);
              _Var8._M_pi = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              peVar7 = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var5 = ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       var1).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)peVar7;
              ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   _Var8._M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              Builder::getvarbyname((Builder *)&local_b8,(string *)local_a0);
              _Var8._M_pi = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              peVar7 = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var5 = ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       var2).super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)peVar7;
              ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   _Var8._M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
              push_back(&((psVar11->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->quadterms,&local_98);
              pPVar14 = pPVar14 + 1;
LAB_001df73a:
              it->_M_current = pPVar14;
              if (local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            if (local_78._M_pi != &local_68) {
              operator_delete(local_78._M_pi);
            }
            pPVar12 = it->_M_current;
          }
          expr = local_40;
          if (local_34 == '\0') {
            pPVar12 = it->_M_current;
            if (pPVar12 == end._M_current) {
              piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar13,"File not existent or illegal file format.");
              goto LAB_001dfb98;
            }
            if (pPVar12->type != BRKCL) {
              piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar13,"File not existent or illegal file format.");
              goto LAB_001dfb98;
            }
            goto LAB_001df37b;
          }
          pPVar12 = it->_M_current;
          if ((pPVar12 + 1 == end._M_current) || (pPVar12 + 2 == end._M_current)) {
            piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar13,"File not existent or illegal file format.");
LAB_001dfb98:
            __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          if (it->_M_current->type != BRKCL) {
            piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar13,"File not existent or illegal file format.");
            goto LAB_001dfb98;
          }
          if (pPVar12[1].type != SLASH) {
            piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar13,"File not existent or illegal file format.");
            goto LAB_001dfb98;
          }
          if (pPVar12[2].type != CONST) {
            piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar13,"File not existent or illegal file format.");
            goto LAB_001dfb98;
          }
          if ((pPVar12[2].field_1.value != 2.0) || (NAN(pPVar12[2].field_1.value))) {
            piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar13,"File not existent or illegal file format.");
            goto LAB_001dfb98;
          }
          pPVar12 = pPVar12 + 3;
          goto LAB_001df37f;
        }
        bVar6 = false;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_78,it->_M_current[1].field_1.name,(allocator *)&local_98);
        local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)operator_new(0x18);
        ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
        super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
        super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
        super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x3ff0000000000000;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<LinTerm*>
                  (&local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (LinTerm *)
                   local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2).
        super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)it->_M_current->field_1;
        Builder::getvarbyname((Builder *)&local_b8,(string *)local_a0);
        _Var8._M_pi = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
        peVar7 = local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var5 = ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
                 super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
        super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)peVar7;
        ((local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1).
        super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        if (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        std::vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>::push_back
                  (&((expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    linterms,(value_type *)&local_98);
        it->_M_current = it->_M_current + 2;
LAB_001df426:
        if (local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if (local_78._M_pi != &local_68) {
          operator_delete(local_78._M_pi);
        }
LAB_001df449:
        bVar6 = true;
      }
    } while ((bVar6) && (it->_M_current != end._M_current));
  }
  return;
}

Assistant:

void Reader::parseexpression(std::vector<ProcessedToken>::iterator& it,
                             std::vector<ProcessedToken>::iterator end,
                             std::shared_ptr<Expression> expr, bool isobj) {
  if (it != end && it->type == ProcessedTokenType::CONID) {
    expr->name = it->name;
    ++it;
  }

  while (it != end) {
    std::vector<ProcessedToken>::iterator next = it;
    ++next;
    // const var
    if (next != end && it->type == ProcessedTokenType::CONST &&
        next->type == ProcessedTokenType::VARID) {
      std::string name = next->name;

      std::shared_ptr<LinTerm> linterm =
          std::shared_ptr<LinTerm>(new LinTerm());
      linterm->coef = it->value;
      linterm->var = builder.getvarbyname(name);
      //	 printf("LpReader: Term   %+g %s\n", linterm->coef,
      //name.c_str());
      expr->linterms.push_back(linterm);

      ++it;
      ++it;
      continue;
    }

    // const
    if (it->type == ProcessedTokenType::CONST) {
      //      printf("LpReader: Offset change from %+g by %+g\n", expr->offset, it->value);
      expr->offset += it->value;
      ++it;
      continue;
    }

    // var
    if (it->type == ProcessedTokenType::VARID) {
      std::string name = it->name;

      std::shared_ptr<LinTerm> linterm =
          std::shared_ptr<LinTerm>(new LinTerm());
      linterm->coef = 1.0;
      linterm->var = builder.getvarbyname(name);
      //	 printf("LpReader: Term   %+g %s\n", linterm->coef,
      //name.c_str());
      expr->linterms.push_back(linterm);

      ++it;
      continue;
    }

    // quadratic expression
    if (next != end && it->type == ProcessedTokenType::BRKOP) {
      ++it;
      while (it != end && it->type != ProcessedTokenType::BRKCL) {
        // const var hat const
        std::vector<ProcessedToken>::iterator next1 = it;  // token after it
        std::vector<ProcessedToken>::iterator next2 = it;  // token 2nd-after it
        std::vector<ProcessedToken>::iterator next3 = it;  // token 3rd-after it
        ++next1;
        ++next2;
        ++next3;
        if (next1 != end) {
          ++next2;
          ++next3;
        }
        if (next2 != end) ++next3;

        if (next3 != end && it->type == ProcessedTokenType::CONST &&
            next1->type == ProcessedTokenType::VARID &&
            next2->type == ProcessedTokenType::HAT &&
            next3->type == ProcessedTokenType::CONST) {
          std::string name = next1->name;

          lpassert(next3->value == 2.0);

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = it->value;
          quadterm->var1 = builder.getvarbyname(name);
          quadterm->var2 = builder.getvarbyname(name);
          expr->quadterms.push_back(quadterm);

          it = ++next3;
          continue;
        }

        // var hat const
        if (next2 != end && it->type == ProcessedTokenType::VARID &&
            next1->type == ProcessedTokenType::HAT &&
            next2->type == ProcessedTokenType::CONST) {
          std::string name = it->name;

          lpassert(next2->value == 2.0);

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = 1.0;
          quadterm->var1 = builder.getvarbyname(name);
          quadterm->var2 = builder.getvarbyname(name);
          expr->quadterms.push_back(quadterm);

          it = next3;
          continue;
        }

        // const var asterisk var
        if (next3 != end && it->type == ProcessedTokenType::CONST &&
            next1->type == ProcessedTokenType::VARID &&
            next2->type == ProcessedTokenType::ASTERISK &&
            next3->type == ProcessedTokenType::VARID) {
          std::string name1 = next1->name;
          std::string name2 = next3->name;

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = it->value;
          quadterm->var1 = builder.getvarbyname(name1);
          quadterm->var2 = builder.getvarbyname(name2);
          expr->quadterms.push_back(quadterm);

          it = ++next3;
          continue;
        }

        // var asterisk var
        if (next2 != end && it->type == ProcessedTokenType::VARID &&
            next1->type == ProcessedTokenType::ASTERISK &&
            next2->type == ProcessedTokenType::VARID) {
          std::string name1 = it->name;
          std::string name2 = next2->name;

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = 1.0;
          quadterm->var1 = builder.getvarbyname(name1);
          quadterm->var2 = builder.getvarbyname(name2);
          expr->quadterms.push_back(quadterm);

          it = next3;
          continue;
        }
        break;
      }
      if (isobj) {
        // only in the objective function, a quadratic term is followed by
        // "/2.0"
        std::vector<ProcessedToken>::iterator next1 = it;  // token after it
        std::vector<ProcessedToken>::iterator next2 = it;  // token 2nd-after it
        ++next1;
        ++next2;
        if (next1 != end) ++next2;

        lpassert(next2 != end);
        lpassert(it->type == ProcessedTokenType::BRKCL);
        lpassert(next1->type == ProcessedTokenType::SLASH);
        lpassert(next2->type == ProcessedTokenType::CONST);
        lpassert(next2->value == 2.0);
        it = ++next2;
      } else {
        lpassert(it != end);
        lpassert(it->type == ProcessedTokenType::BRKCL);
        ++it;
      }
      continue;
    }

    break;
  }
}